

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

bool bssl::ssl_client_hello_decrypt
               (SSL_HANDSHAKE *hs,uint8_t *out_alert,bool *out_is_decrypt_error,
               Array<unsigned_char> *out,SSL_CLIENT_HELLO *client_hello_outer,
               Span<const_unsigned_char> payload)

{
  long lVar1;
  long lVar2;
  SSL *pSVar3;
  Span<const_unsigned_char> lhs;
  bool bVar4;
  int iVar5;
  uchar *puVar6;
  uchar *puVar7;
  size_t sVar8;
  evp_hpke_ctx_st *ctx;
  size_t in_len;
  size_t ad_len;
  Span<unsigned_char> SVar9;
  Span<const_unsigned_char> encoded_client_hello_inner;
  Span<const_unsigned_char> in;
  SSL_CLIENT_HELLO *in_stack_fffffffffffffdf8;
  int local_100 [2];
  uchar *local_f8;
  Array<unsigned_char> *local_f0;
  uchar *local_e8;
  size_t local_e0;
  size_t len;
  size_t sStack_d0;
  Span<const_unsigned_char> local_c8;
  uchar *local_b8;
  size_t sStack_b0;
  uchar local_99 [1];
  undefined1 local_98 [7];
  uint8_t kBadPayload [1];
  Array<unsigned_char> encoded;
  undefined1 local_78 [8];
  Span<unsigned_char> payload_aad;
  Span<const_unsigned_char> local_58;
  undefined1 local_48 [8];
  Array<unsigned_char> aad;
  SSL_CLIENT_HELLO *client_hello_outer_local;
  Array<unsigned_char> *out_local;
  bool *out_is_decrypt_error_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  *out_is_decrypt_error = false;
  aad.size_ = (size_t)client_hello_outer;
  Array<unsigned_char>::Array((Array<unsigned_char> *)local_48);
  Span<const_unsigned_char>::Span
            (&local_58,*(uchar **)(aad.size_ + 8),*(size_t *)(aad.size_ + 0x10));
  bVar4 = Array<unsigned_char>::CopyFrom((Array<unsigned_char> *)local_48,local_58);
  if (!bVar4) {
    *out_alert = 'P';
    hs_local._7_1_ = false;
    payload_aad.size_._0_4_ = 1;
    goto LAB_0032d973;
  }
  puVar7 = *(uchar **)(aad.size_ + 0x70);
  puVar6 = Span<const_unsigned_char>::data(&payload);
  if (puVar6 < puVar7) {
    __assert_fail("reinterpret_cast<uintptr_t>(client_hello_outer->extensions) <= reinterpret_cast<uintptr_t>(payload.data())"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,0x121,
                  "bool bssl::ssl_client_hello_decrypt(SSL_HANDSHAKE *, uint8_t *, bool *, Array<uint8_t> *, const SSL_CLIENT_HELLO *, Span<const uint8_t>)"
                 );
  }
  lVar1 = *(long *)(aad.size_ + 0x70);
  lVar2 = *(long *)(aad.size_ + 0x78);
  puVar7 = Span<const_unsigned_char>::data(&payload);
  sVar8 = Span<const_unsigned_char>::size(&payload);
  if ((uchar *)(lVar1 + lVar2) < puVar7 + sVar8) {
    __assert_fail("reinterpret_cast<uintptr_t>(client_hello_outer->extensions + client_hello_outer->extensions_len) >= reinterpret_cast<uintptr_t>(payload.data() + payload.size())"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,0x124,
                  "bool bssl::ssl_client_hello_decrypt(SSL_HANDSHAKE *, uint8_t *, bool *, Array<uint8_t> *, const SSL_CLIENT_HELLO *, Span<const uint8_t>)"
                 );
  }
  Span<unsigned_char>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
            ((Span<unsigned_char> *)&encoded.size_,(Array<unsigned_char> *)local_48);
  puVar7 = Span<const_unsigned_char>::data(&payload);
  lVar1 = *(long *)(aad.size_ + 8);
  sVar8 = Span<const_unsigned_char>::size(&payload);
  SVar9 = Span<unsigned_char>::subspan
                    ((Span<unsigned_char> *)&encoded.size_,(long)puVar7 - lVar1,sVar8);
  payload_aad.data_ = (uchar *)SVar9.size_;
  local_78 = (undefined1  [8])SVar9.data_;
  puVar7 = Span<unsigned_char>::data((Span<unsigned_char> *)local_78);
  sVar8 = Span<unsigned_char>::size((Span<unsigned_char> *)local_78);
  ::OPENSSL_memset(puVar7,0,sVar8);
  Array<unsigned_char>::Array((Array<unsigned_char> *)local_98);
  iVar5 = CRYPTO_fuzzer_mode_enabled();
  if (iVar5 == 0) {
    sVar8 = Span<const_unsigned_char>::size(&payload);
    bVar4 = Array<unsigned_char>::InitForOverwrite((Array<unsigned_char> *)local_98,sVar8);
    if (bVar4) {
      ctx = internal::
            StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::get
                      (&hs->ech_hpke_ctx);
      puVar7 = Array<unsigned_char>::data((Array<unsigned_char> *)local_98);
      sVar8 = Array<unsigned_char>::size((Array<unsigned_char> *)local_98);
      puVar6 = Span<const_unsigned_char>::data(&payload);
      in_len = Span<const_unsigned_char>::size(&payload);
      in_stack_fffffffffffffdf8 =
           (SSL_CLIENT_HELLO *)Array<unsigned_char>::data((Array<unsigned_char> *)local_48);
      ad_len = Array<unsigned_char>::size((Array<unsigned_char> *)local_48);
      iVar5 = EVP_HPKE_CTX_open(ctx,puVar7,&local_e0,sVar8,puVar6,in_len,
                                (uint8_t *)in_stack_fffffffffffffdf8,ad_len);
      if (iVar5 != 0) {
        Array<unsigned_char>::Shrink((Array<unsigned_char> *)local_98,local_e0);
        goto LAB_0032d893;
      }
      *out_alert = '3';
      *out_is_decrypt_error = true;
      ERR_put_error(0x10,0,0x8a,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0x145);
      hs_local._7_1_ = false;
    }
    else {
      *out_alert = 'P';
      hs_local._7_1_ = false;
    }
  }
  else {
    local_99[0] = 0xff;
    local_b8 = payload.data_;
    sStack_b0 = payload.size_;
    Span<unsigned_char_const>::Span<1ul>((Span<unsigned_char_const> *)&local_c8,&local_99);
    lhs.size_ = sStack_b0;
    lhs.data_ = local_b8;
    bVar4 = internal::operator==(lhs,local_c8);
    if (bVar4) {
      *out_alert = '3';
      *out_is_decrypt_error = true;
      ERR_put_error(0x10,0,0x8a,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0x133);
      hs_local._7_1_ = false;
    }
    else {
      len = (size_t)payload.data_;
      sStack_d0 = payload.size_;
      bVar4 = Array<unsigned_char>::CopyFrom((Array<unsigned_char> *)local_98,payload);
      if (bVar4) {
LAB_0032d893:
        pSVar3 = hs->ssl;
        Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                  ((Span<unsigned_char_const> *)&local_f0,(Array<unsigned_char> *)local_98);
        encoded_client_hello_inner.size_ = aad.size_;
        encoded_client_hello_inner.data_ = local_e8;
        sVar8 = aad.size_;
        bVar4 = ssl_decode_client_hello_inner
                          ((bssl *)pSVar3,(SSL *)out_alert,(uint8_t *)out,local_f0,
                           encoded_client_hello_inner,in_stack_fffffffffffffdf8);
        if (bVar4) {
          pSVar3 = hs->ssl;
          Span<unsigned_char_const>::
          Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                    ((Span<unsigned_char_const> *)local_100,out);
          in.size_ = sVar8;
          in.data_ = local_f8;
          ssl_do_msg_callback((bssl *)pSVar3,(SSL *)0x0,0x101,local_100[0],in);
          hs_local._7_1_ = true;
        }
        else {
          hs_local._7_1_ = false;
        }
      }
      else {
        *out_alert = 'P';
        hs_local._7_1_ = false;
      }
    }
  }
  payload_aad.size_._0_4_ = 1;
  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_98);
LAB_0032d973:
  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_48);
  return hs_local._7_1_;
}

Assistant:

bool ssl_client_hello_decrypt(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                              bool *out_is_decrypt_error, Array<uint8_t> *out,
                              const SSL_CLIENT_HELLO *client_hello_outer,
                              Span<const uint8_t> payload) {
  *out_is_decrypt_error = false;

  // The ClientHelloOuterAAD is |client_hello_outer| with |payload| (which must
  // point within |client_hello_outer->extensions|) replaced with zeros. See
  // draft-ietf-tls-esni-13, section 5.2.
  Array<uint8_t> aad;
  if (!aad.CopyFrom(Span(client_hello_outer->client_hello,
                         client_hello_outer->client_hello_len))) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }

  // We assert with |uintptr_t| because the comparison would be UB if they
  // didn't alias.
  assert(reinterpret_cast<uintptr_t>(client_hello_outer->extensions) <=
         reinterpret_cast<uintptr_t>(payload.data()));
  assert(reinterpret_cast<uintptr_t>(client_hello_outer->extensions +
                                     client_hello_outer->extensions_len) >=
         reinterpret_cast<uintptr_t>(payload.data() + payload.size()));
  Span<uint8_t> payload_aad = Span(aad).subspan(
      payload.data() - client_hello_outer->client_hello, payload.size());
  OPENSSL_memset(payload_aad.data(), 0, payload_aad.size());

  // Decrypt the EncodedClientHelloInner.
  Array<uint8_t> encoded;
  if (CRYPTO_fuzzer_mode_enabled()) {
    // In fuzzer mode, disable encryption to improve coverage. We reserve a
    // short input to signal decryption failure, so the fuzzer can explore
    // fallback to ClientHelloOuter.
    const uint8_t kBadPayload[] = {0xff};
    if (payload == kBadPayload) {
      *out_alert = SSL_AD_DECRYPT_ERROR;
      *out_is_decrypt_error = true;
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECRYPTION_FAILED);
      return false;
    }
    if (!encoded.CopyFrom(payload)) {
      *out_alert = SSL_AD_INTERNAL_ERROR;
      return false;
    }
  } else {
    if (!encoded.InitForOverwrite(payload.size())) {
      *out_alert = SSL_AD_INTERNAL_ERROR;
      return false;
    }
    size_t len;
    if (!EVP_HPKE_CTX_open(hs->ech_hpke_ctx.get(), encoded.data(), &len,
                           encoded.size(), payload.data(), payload.size(),
                           aad.data(), aad.size())) {
      *out_alert = SSL_AD_DECRYPT_ERROR;
      *out_is_decrypt_error = true;
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECRYPTION_FAILED);
      return false;
    }
    encoded.Shrink(len);
  }

  if (!ssl_decode_client_hello_inner(hs->ssl, out_alert, out, encoded,
                                     client_hello_outer)) {
    return false;
  }

  ssl_do_msg_callback(hs->ssl, /*is_write=*/0, SSL3_RT_CLIENT_HELLO_INNER,
                      *out);
  return true;
}